

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall
XmlModelSerialiserPrivate::readXml(XmlModelSerialiserPrivate *this,QXmlStreamReader *reader)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemModel *pQVar2;
  QXmlStreamReader *source;
  bool bVar3;
  byte bVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  QStringView QVar8;
  byte local_849;
  byte local_839;
  bool local_7cc;
  byte local_7c9;
  byte local_7b9;
  byte local_7a9;
  byte local_741;
  QModelIndex local_708;
  QModelIndex local_6f0;
  QModelIndex local_6d8;
  QModelIndex local_6c0;
  QArrayDataPointer<char16_t> local_6a8;
  QString local_690;
  QStringView local_678;
  QStringView local_668;
  QArrayDataPointer<char16_t> local_658;
  QString local_640;
  QStringView local_628;
  QStringView local_618;
  QArrayDataPointer<char16_t> local_608;
  QString local_5f0;
  QStringView local_5d8;
  QStringView local_5c8;
  QString local_5b8;
  undefined1 local_5a0 [8];
  QVariant roleVariant;
  QString local_568;
  QStringView local_550;
  int local_53c;
  undefined1 local_538 [4];
  int headerType;
  QString local_520;
  QStringView local_508;
  int local_4f4;
  undefined1 local_4f0 [4];
  int headerRole;
  QString local_4d8;
  QStringView local_4c0;
  int local_4ac;
  int local_4a8;
  int headerSection;
  QArrayDataPointer<char16_t> local_4a0;
  QString local_488;
  byte local_46a;
  byte local_469;
  QArrayDataPointer<char16_t> local_468;
  QString local_450;
  QArrayDataPointer<char16_t> local_438;
  QString local_420;
  QXmlStreamAttributes local_408 [8];
  QXmlStreamAttributes headDataAttribute;
  QArrayDataPointer<char16_t> local_3f0;
  QString local_3d8;
  QStringView local_3c0;
  QStringView local_3b0;
  QArrayDataPointer<char16_t> local_3a0;
  QString local_388;
  QStringView local_370;
  QStringView local_360;
  QArrayDataPointer<char16_t> local_350;
  QString local_338;
  QStringView local_320;
  QStringView local_310;
  QArrayDataPointer<char16_t> local_300;
  QString local_2e8;
  QStringView local_2d0;
  QStringView local_2c0;
  QModelIndex local_2b0;
  QModelIndex local_298;
  QModelIndex local_280;
  QModelIndex local_268;
  QModelIndex local_250;
  QArrayDataPointer<char16_t> local_228;
  QString local_210;
  QStringView local_1f8;
  QStringView local_1e8;
  byte local_1d3;
  byte local_1d2;
  byte local_1d1;
  undefined1 local_1d0 [5];
  bool vHeaderDataStarted;
  bool hHeaderDataStarted;
  bool headerDataStarted;
  QModelIndex local_1b8;
  QModelIndex local_1a0;
  QModelIndex local_188;
  QXmlStreamReader *local_170;
  QXmlStreamReader *reader_local;
  XmlModelSerialiserPrivate *this_local;
  char16_t *local_158;
  char16_t *str_8;
  undefined1 *local_148;
  char16_t *local_140;
  char16_t *str_5;
  QArrayDataPointer<char16_t> *local_130;
  char16_t *local_128;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_118;
  char16_t *local_110;
  char16_t *str_12;
  QArrayDataPointer<char16_t> *local_100;
  char16_t *local_f8;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_e8;
  char16_t *local_e0;
  char16_t *str_10;
  undefined1 *local_d0;
  char16_t *local_c8;
  char16_t *str_9;
  undefined1 *local_b8;
  char16_t *local_b0;
  char16_t *str_7;
  QArrayDataPointer<char16_t> *local_a0;
  char16_t *local_98;
  char16_t *str_6;
  QArrayDataPointer<char16_t> *local_88;
  char16_t *local_80;
  char16_t *str_13;
  QArrayDataPointer<char16_t> *local_70;
  char16_t *local_68;
  char16_t *str_11;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_4;
  QArrayDataPointer<char16_t> *local_10;
  
  if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.m_model ==
      (QAbstractItemModel *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    pQVar2 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    local_170 = reader;
    reader_local = (QXmlStreamReader *)this;
    QModelIndex::QModelIndex(&local_188);
    uVar5 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_188);
    QModelIndex::QModelIndex(&local_1a0);
    (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar5,&local_1a0);
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    pQVar2 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    QModelIndex::QModelIndex(&local_1b8);
    uVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_1b8);
    QModelIndex::QModelIndex((QModelIndex *)local_1d0);
    (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar5,local_1d0);
    local_1d1 = 0;
    local_1d2 = 0;
    local_1d3 = 0;
    do {
      while( true ) {
        while( true ) {
          uVar6 = QXmlStreamReader::atEnd();
          local_741 = 0;
          if ((uVar6 & 1) == 0) {
            bVar3 = QXmlStreamReader::hasError(local_170);
            local_741 = bVar3 ^ 0xff;
          }
          if ((local_741 & 1) == 0) {
            bVar3 = QXmlStreamReader::hasError(local_170);
            if (bVar3) {
              pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_model;
              pQVar2 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_model;
              QModelIndex::QModelIndex(&local_6c0);
              uVar5 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_6c0);
              QModelIndex::QModelIndex(&local_6d8);
              (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar5,&local_6d8);
              pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_model;
              pQVar2 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_model;
              QModelIndex::QModelIndex(&local_6f0);
              uVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_6f0);
              QModelIndex::QModelIndex(&local_708);
              (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar5,&local_708);
              this_local._7_1_ = 0;
            }
            else {
              this_local._7_1_ = 1;
            }
            goto LAB_001468fc;
          }
          QXmlStreamReader::readNext();
          bVar3 = QXmlStreamReader::isStartElement(local_170);
          if (bVar3) break;
          bVar3 = QXmlStreamReader::isEndElement(local_170);
          if (bVar3) {
            QVar8 = (QStringView)QXmlStreamReader::name();
            str_11 = L"HeaderData";
            local_68 = L"HeaderData";
            local_58 = &local_608;
            local_5c8 = QVar8;
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_608,(Data *)0x0,L"HeaderData",10);
            QString::QString(&local_5f0,&local_608);
            QStringView::QStringView<QString,_true>(&local_5d8,&local_5f0);
            bVar3 = ::operator==(local_5c8,local_5d8);
            QString::~QString(&local_5f0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_608);
            if (bVar3) {
              local_1d1 = 0;
            }
            else {
              QVar8 = (QStringView)QXmlStreamReader::name();
              str_12 = L"Vertical";
              local_110 = L"Vertical";
              local_100 = &local_658;
              local_618 = QVar8;
              QArrayDataPointer<char16_t>::QArrayDataPointer(&local_658,(Data *)0x0,L"Vertical",8);
              QString::QString(&local_640,&local_658);
              QStringView::QStringView<QString,_true>(&local_628,&local_640);
              bVar3 = ::operator==(local_618,local_628);
              local_839 = 0;
              if (bVar3) {
                local_839 = local_1d1;
              }
              QString::~QString(&local_640);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_658);
              if ((local_839 & 1) == 0) {
                QVar8 = (QStringView)QXmlStreamReader::name();
                str_13 = L"Horizontal";
                local_80 = L"Horizontal";
                local_70 = &local_6a8;
                local_668 = QVar8;
                QArrayDataPointer<char16_t>::QArrayDataPointer
                          (&local_6a8,(Data *)0x0,L"Horizontal",10);
                QString::QString(&local_690,&local_6a8);
                QStringView::QStringView<QString,_true>(&local_678,&local_690);
                bVar3 = ::operator==(local_668,local_678);
                local_849 = 0;
                if (bVar3) {
                  local_849 = local_1d1;
                }
                QString::~QString(&local_690);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6a8);
                if ((local_849 & 1) != 0) {
                  local_1d2 = 0;
                }
              }
              else {
                local_1d3 = 0;
              }
            }
          }
        }
        QVar8 = (QStringView)QXmlStreamReader::name();
        str = L"Element";
        local_128 = L"Element";
        local_118 = &local_228;
        local_1e8 = QVar8;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_228,(Data *)0x0,L"Element",7);
        QString::QString(&local_210,&local_228);
        QStringView::QStringView<QString,_true>(&local_1f8,&local_210);
        bVar3 = ::operator==(local_1e8,local_1f8);
        QString::~QString(&local_210);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
        source = local_170;
        if (bVar3) break;
        QVar8 = (QStringView)QXmlStreamReader::name();
        str_1 = L"HeaderData";
        local_38 = L"HeaderData";
        local_28 = &local_300;
        local_2c0 = QVar8;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_300,(Data *)0x0,L"HeaderData",10);
        QString::QString(&local_2e8,&local_300);
        QStringView::QStringView<QString,_true>(&local_2d0,&local_2e8);
        bVar3 = ::operator==(local_2c0,local_2d0);
        QString::~QString(&local_2e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_300);
        if (bVar3) {
          local_1d1 = 1;
        }
        else {
          QVar8 = (QStringView)QXmlStreamReader::name();
          str_2 = L"Vertical";
          local_f8 = L"Vertical";
          local_e8 = &local_350;
          local_310 = QVar8;
          QArrayDataPointer<char16_t>::QArrayDataPointer(&local_350,(Data *)0x0,L"Vertical",8);
          QString::QString(&local_338,&local_350);
          QStringView::QStringView<QString,_true>(&local_320,&local_338);
          bVar3 = ::operator==(local_310,local_320);
          local_7a9 = 0;
          if (bVar3) {
            local_7a9 = local_1d1;
          }
          QString::~QString(&local_338);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_350);
          if ((local_7a9 & 1) == 0) {
            QVar8 = (QStringView)QXmlStreamReader::name();
            str_3 = L"Horizontal";
            local_50 = L"Horizontal";
            local_40 = &local_3a0;
            local_360 = QVar8;
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3a0,(Data *)0x0,L"Horizontal",10);
            QString::QString(&local_388,&local_3a0);
            QStringView::QStringView<QString,_true>(&local_370,&local_388);
            bVar3 = ::operator==(local_360,local_370);
            local_7b9 = 0;
            if (bVar3) {
              local_7b9 = local_1d1;
            }
            QString::~QString(&local_388);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a0);
            if ((local_7b9 & 1) == 0) {
              QVar8 = (QStringView)QXmlStreamReader::name();
              str_4 = L"HeaderDataPoint";
              local_20 = L"HeaderDataPoint";
              local_10 = &local_3f0;
              local_3b0 = QVar8;
              QArrayDataPointer<char16_t>::QArrayDataPointer
                        (&local_3f0,(Data *)0x0,L"HeaderDataPoint",0xf);
              QString::QString(&local_3d8,&local_3f0);
              QStringView::QStringView<QString,_true>(&local_3c0,&local_3d8);
              bVar3 = ::operator==(local_3b0,local_3c0);
              local_7c9 = 0;
              if (bVar3) {
                local_7c9 = local_1d1;
              }
              QString::~QString(&local_3d8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3f0);
              if ((local_7c9 & 1) != 0) {
                if (((local_1d3 & 1) == 0) && ((local_1d2 & 1) == 0)) {
                  this_local._7_1_ = 0;
                  goto LAB_001468fc;
                }
                QXmlStreamReader::attributes();
                local_469 = 0;
                local_46a = 0;
                headerSection._3_1_ = 0;
                headerSection._2_1_ = 0;
                local_130 = &local_438;
                str_5 = L"Section";
                local_140 = L"Section";
                QArrayDataPointer<char16_t>::QArrayDataPointer(&local_438,(Data *)0x0,L"Section",7);
                QString::QString(&local_420,&local_438);
                bVar3 = QXmlStreamAttributes::hasAttribute(local_408,&local_420);
                local_7cc = false;
                if (bVar3) {
                  local_88 = &local_468;
                  str_6 = L"Role";
                  local_98 = L"Role";
                  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_468,(Data *)0x0,L"Role",4);
                  local_469 = 1;
                  QString::QString(&local_450,&local_468);
                  local_46a = 1;
                  bVar3 = QXmlStreamAttributes::hasAttribute(local_408,&local_450);
                  local_7cc = false;
                  if (bVar3) {
                    local_a0 = &local_4a0;
                    str_7 = L"Type";
                    local_b0 = L"Type";
                    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_4a0,(Data *)0x0,L"Type",4)
                    ;
                    headerSection._3_1_ = 1;
                    QString::QString(&local_488,&local_4a0);
                    headerSection._2_1_ = 1;
                    local_7cc = QXmlStreamAttributes::hasAttribute(local_408,&local_488);
                  }
                }
                if ((headerSection._2_1_ & 1) != 0) {
                  QString::~QString(&local_488);
                }
                if ((headerSection._3_1_ & 1) != 0) {
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4a0);
                }
                if ((local_46a & 1) != 0) {
                  QString::~QString(&local_450);
                }
                if ((local_469 & 1) != 0) {
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_468);
                }
                QString::~QString(&local_420);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_438);
                if (((local_7cc ^ 0xffU) & 1) == 0) {
                  local_148 = local_4f0;
                  str_8 = L"Section";
                  local_158 = L"Section";
                  QArrayDataPointer<char16_t>::QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_4f0,(Data *)0x0,L"Section",7);
                  QString::QString(&local_4d8,(DataPointer *)local_4f0);
                  QVar8 = (QStringView)QXmlStreamAttributes::value((QString *)local_408);
                  local_4c0 = QVar8;
                  iVar7 = QStringView::toInt(&local_4c0,(bool *)0x0,10);
                  QString::~QString(&local_4d8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_4f0);
                  local_b8 = local_538;
                  str_9 = L"Role";
                  local_c8 = L"Role";
                  local_4ac = iVar7;
                  QArrayDataPointer<char16_t>::QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_538,(Data *)0x0,L"Role",4);
                  QString::QString(&local_520,(DataPointer *)local_538);
                  QVar8 = (QStringView)QXmlStreamAttributes::value((QString *)local_408);
                  local_508 = QVar8;
                  iVar7 = QStringView::toInt(&local_508,(bool *)0x0,10);
                  QString::~QString(&local_520);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_538);
                  local_d0 = &roleVariant.d.field_0x18;
                  str_10 = L"Type";
                  local_e0 = L"Type";
                  local_4f4 = iVar7;
                  QArrayDataPointer<char16_t>::QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&roleVariant.d.field_0x18,(Data *)0x0,
                             L"Type",4);
                  QString::QString(&local_568,(DataPointer *)&roleVariant.d.field_0x18);
                  QVar8 = (QStringView)QXmlStreamAttributes::value((QString *)local_408);
                  local_550 = QVar8;
                  iVar7 = QStringView::toInt(&local_550,(bool *)0x0,10);
                  QString::~QString(&local_568);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&roleVariant.d.field_0x18);
                  local_53c = iVar7;
                  QXmlStreamReader::readElementText(&local_5b8,local_170,0);
                  AbstractStringSerialiserPrivate::loadVariant
                            ((QVariant *)local_5a0,&this->super_AbstractStringSerialiserPrivate,
                             iVar7,&local_5b8);
                  QString::~QString(&local_5b8);
                  bVar4 = ::QVariant::isNull();
                  if ((bVar4 & 1) == 0) {
                    pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                             super_AbstractModelSerialiserPrivate.m_model;
                    (**(code **)(*(long *)pQVar1 + 0xa8))
                              (pQVar1,local_4ac,(local_1d3 & 1) + 1,local_5a0,local_4f4);
                  }
                  ::QVariant::~QVariant((QVariant *)local_5a0);
                  local_4a8 = 0;
                }
                else {
                  this_local._7_1_ = 0;
                  local_4a8 = 1;
                }
                QXmlStreamAttributes::~QXmlStreamAttributes(local_408);
                if (local_4a8 != 0) goto LAB_001468fc;
              }
            }
            else {
              if ((local_1d3 & 1) != 0) {
                this_local._7_1_ = 0;
                goto LAB_001468fc;
              }
              local_1d2 = 1;
            }
          }
          else {
            if ((local_1d2 & 1) != 0) {
              this_local._7_1_ = 0;
              goto LAB_001468fc;
            }
            local_1d3 = 1;
          }
        }
      }
      QModelIndex::QModelIndex(&local_250);
      bVar3 = readXmlElement(this,source,&local_250);
    } while (((bVar3 ^ 0xffU) & 1) == 0);
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    pQVar2 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    QModelIndex::QModelIndex(&local_268);
    uVar5 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_268);
    QModelIndex::QModelIndex(&local_280);
    (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar5,&local_280);
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    pQVar2 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    QModelIndex::QModelIndex(&local_298);
    uVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_298);
    QModelIndex::QModelIndex(&local_2b0);
    (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar5,&local_2b0);
    this_local._7_1_ = 0;
  }
LAB_001468fc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool XmlModelSerialiserPrivate::readXml(QXmlStreamReader &reader)
{
    if (!m_model)
        return false;
    m_model->removeColumns(0, m_model->columnCount());
    m_model->removeRows(0, m_model->rowCount());
    bool headerDataStarted = false;
    bool hHeaderDataStarted = false;
    bool vHeaderDataStarted = false;
    while (!reader.atEnd() && !reader.hasError()) {
        reader.readNext();
        if (reader.isStartElement()) {
            if (reader.name() == QStringLiteral("Element")) {
                if (!readXmlElement(reader)) {
                    m_model->removeColumns(0, m_model->columnCount());
                    m_model->removeRows(0, m_model->rowCount());
                    return false;
                }
            } else if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = true;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                if (hHeaderDataStarted)
                    return false;
                vHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                if (vHeaderDataStarted)
                    return false;
                hHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("HeaderDataPoint") && headerDataStarted) {
                if (!(vHeaderDataStarted || hHeaderDataStarted))
                    return false;
                const QXmlStreamAttributes headDataAttribute = reader.attributes();
                if (!(headDataAttribute.hasAttribute(QStringLiteral("Section")) && headDataAttribute.hasAttribute(QStringLiteral("Role"))
                      && headDataAttribute.hasAttribute(QStringLiteral("Type"))))
                    return false;
                int headerSection = headDataAttribute.value(QStringLiteral("Section")).toInt();
                int headerRole = headDataAttribute.value(QStringLiteral("Role")).toInt();
                int headerType = headDataAttribute.value(QStringLiteral("Type")).toInt();
                const QVariant roleVariant = loadVariant(headerType, reader.readElementText());
                if (!roleVariant.isNull()) // skip unhandled types
                    m_model->setHeaderData(headerSection, (vHeaderDataStarted ? Qt::Vertical : Qt::Horizontal), roleVariant, headerRole);
            }

        } else if (reader.isEndElement()) {
            if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = false;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                vHeaderDataStarted = false;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                hHeaderDataStarted = false;
            }
        }
    }
    if (reader.hasError()) {
        m_model->removeColumns(0, m_model->columnCount());
        m_model->removeRows(0, m_model->rowCount());
        return false;
    }
    return true;
}